

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O1

QString * __thiscall
FileHdrWrapper::translateFieldContent
          (QString *__return_storage_ptr__,FileHdrWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PEFile *this_00;
  QByteArrayView QVar4;
  Data *local_38;
  char16_t *local_30;
  qsizetype local_28;
  
  iVar3 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    if (fieldId == 2) {
      pEVar1 = (this->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
      if (pEVar1 == (Executable *)0x0) {
        this_00 = (PEFile *)0x0;
      }
      else {
        this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
      }
      if ((this_00 == (PEFile *)0x0) || (bVar2 = PEFile::isReproBuild(this_00), !bVar2)) {
        util::getDateString(__return_storage_ptr__,
                            (ulong)*(uint *)(CONCAT44(extraout_var,iVar3) + 4));
        return __return_storage_ptr__;
      }
    }
    else if (fieldId == 0) {
      translateMachine(0);
      return __return_storage_ptr__;
    }
  }
  QVar4.m_data = (storage_type *)0x0;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_38;
  (__return_storage_ptr__->d).ptr = local_30;
  (__return_storage_ptr__->d).size = local_28;
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::translateFieldContent(size_t fieldId)
{
    IMAGE_FILE_HEADER * hdr = reinterpret_cast<IMAGE_FILE_HEADER*>(getPtr());
    if (!hdr) return "";

    IMAGE_FILE_HEADER &fileHeader = (*hdr);
    switch (fieldId) {
        case MACHINE: return FileHdrWrapper::translateMachine(fileHeader.Machine);
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return ""; // This is not a real timestamp
            }
            return util::getDateString(fileHeader.TimeDateStamp);
        }
    }
    return "";
}